

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeCreator::createConstraintPair(MoleculeCreator *this,Molecule *mol)

{
  bool bVar1;
  BondType *pBVar2;
  ConstraintPair *this_00;
  ConstraintElem *consElemB;
  ConstraintElem *consElemA;
  FixedBondType *fbt;
  BondType *bt;
  ConstraintPair *cPair;
  Bond *bond;
  BondIterator bi;
  ConstraintElem *in_stack_ffffffffffffff58;
  Molecule *in_stack_ffffffffffffff60;
  ConstraintPair *in_stack_ffffffffffffff68;
  Molecule *in_stack_ffffffffffffff70;
  BondType *local_70;
  Bond *local_20;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_18 [3];
  
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(local_18);
  local_20 = Molecule::beginBond(in_stack_ffffffffffffff70,(iterator *)in_stack_ffffffffffffff68);
  while (local_20 != (Bond *)0x0) {
    pBVar2 = Bond::getBondType(local_20);
    if (pBVar2 == (BondType *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_ffffffffffffff60,(type_info *)in_stack_ffffffffffffff58
                      );
    if (bVar1) {
      if (pBVar2 == (BondType *)0x0) {
        local_70 = (BondType *)0x0;
      }
      else {
        local_70 = (BondType *)__dynamic_cast(pBVar2,&BondType::typeinfo,&FixedBondType::typeinfo);
      }
      in_stack_ffffffffffffff58 = (ConstraintElem *)operator_new(0x28);
      Bond::getAtomA((Bond *)0x1f7206);
      ConstraintElem::ConstraintElem((ConstraintElem *)this,(StuntDouble *)mol);
      in_stack_ffffffffffffff60 = (Molecule *)operator_new(0x28);
      Bond::getAtomB((Bond *)0x1f7244);
      ConstraintElem::ConstraintElem((ConstraintElem *)this,(StuntDouble *)mol);
      in_stack_ffffffffffffff70 = in_stack_ffffffffffffff60;
      this_00 = (ConstraintPair *)operator_new(0x28);
      in_stack_ffffffffffffff68 = (ConstraintPair *)BondType::getEquilibriumBondLength(local_70);
      ConstraintPair::ConstraintPair
                (this_00,in_stack_ffffffffffffff58,(ConstraintElem *)in_stack_ffffffffffffff60,
                 (RealType)in_stack_ffffffffffffff68,false);
      Molecule::addConstraintPair(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    local_20 = Molecule::nextBond(in_stack_ffffffffffffff70,(iterator *)in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void MoleculeCreator::createConstraintPair(Molecule* mol) {
    // add bond constraints
    Molecule::BondIterator bi;
    Bond* bond;
    ConstraintPair* cPair;

    for (bond = mol->beginBond(bi); bond != NULL; bond = mol->nextBond(bi)) {
      BondType* bt = bond->getBondType();

      if (typeid(FixedBondType) == typeid(*bt)) {
        FixedBondType* fbt = dynamic_cast<FixedBondType*>(bt);

        ConstraintElem* consElemA = new ConstraintElem(bond->getAtomA());
        ConstraintElem* consElemB = new ConstraintElem(bond->getAtomB());
        cPair                     = new ConstraintPair(consElemA, consElemB,
                                                       fbt->getEquilibriumBondLength(), false);
        mol->addConstraintPair(cPair);
      }
    }

    // rigidbody -- rigidbody constraint is not support yet
  }